

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

void __thiscall Hpipe::anon_unknown_7::PcMaker::PcMaker(PcMaker *this,Context *orig)

{
  Vec<unsigned_int> local_28;
  
  local_28.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair<const_int_&,_true>
            (&this->res,&orig->flags,&local_28);
  if (local_28.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  this->orig = orig;
  (this->res).first.mark = orig->mark;
  return;
}

Assistant:

PcMaker( const Context *orig ) : res{ orig->flags, {} }, orig{ orig } {
        res.first.mark = orig->mark;
    }